

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_store_Fptr(FITSfile *Fptr,int *status)

{
  int iVar1;
  long lVar2;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    lVar2 = 0;
    do {
      if (FptrTable[lVar2] == (FITSfile *)0x0) {
        FptrTable[lVar2] = Fptr;
        return iVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10000);
  }
  return iVar1;
}

Assistant:

int fits_store_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   store the new Fptr address for future use by fits_already_open 
*/
{
    int ii;

    if (*status > 0)
        return(*status);

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == 0) {
            FptrTable[ii] = Fptr;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}